

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.h
# Opt level: O3

bool chrono::utils::ChParserOpenSim::CStrToBool(char *string)

{
  long *plVar1;
  int iVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  string str;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  size_t local_50;
  long local_48 [2];
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  std::__cxx11::string::string((string *)&local_58,string,(allocator *)&local_38);
  local_38 = (long *)CONCAT71(local_38._1_7_,0x20);
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (local_58,local_58._M_current + local_50,(_Iter_equals_val<const_char>)&local_38
                    );
  local_50 = (long)_Var3._M_current - (long)local_58._M_current;
  *_Var3._M_current = '\0';
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"true","");
  plVar1 = local_38;
  if (local_50 == local_30) {
    if (local_50 == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp(local_58._M_current,local_38,local_50);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (plVar1 != local_28) {
    operator_delete(plVar1,local_28[0] + 1);
  }
  if ((long *)local_58._M_current != local_48) {
    operator_delete(local_58._M_current,local_48[0] + 1);
  }
  return bVar4;
}

Assistant:

static inline bool CStrToBool(const char* string) { return stringStripCStr(string) == std::string("true"); }